

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

int mk_wcwidth(wchar_t ucs)

{
  int width;
  wchar_t ucs_local;
  
  width = anon_unknown.dwarf_2ef8ec::widechar_wcwidth(ucs);
  if (width < 0) {
    if (width == -6) {
      width = 2;
    }
    else if (width == -3) {
      width = 1;
    }
    else {
      width = 0;
    }
  }
  return width;
}

Assistant:

int mk_wcwidth(wchar_t ucs)
{
    int width = widechar_wcwidth (ucs);

    if (width >= 0)
      return width;

    // Interpret widened characters as 2 chars
    if (width == widechar_widened_in_9)
      return 2;

    // Interpret ambiguous east-asian characters as 1 char
    // This includes accented characters like á or é
    if (width == widechar_ambiguous)
      return 1;

    // All other negative values
    return 0;
}